

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumFieldGenerator::GenerateMergeFromCodedStream
          (EnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  int iVar1;
  FieldDescriptor *this_00;
  bool bVar2;
  Type TVar3;
  uint uVar4;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint i;
  char *text;
  string local_40;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int value;\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n"
                    );
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = "set_$name$(static_cast< $type$ >(value));\n";
  }
  else {
    io::Printer::Print(printer,variables,
                       "if ($type$_IsValid(value)) {\n  set_$name$(static_cast< $type$ >(value));\n"
                      );
    this_00 = this->descriptor_;
    if ((((this->super_FieldGenerator).options_)->enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(this_00 + 0x30) + 0xa0) + 0xa8) != 3)) {
      io::Printer::Print(printer,variables,
                         "} else {\n  mutable_unknown_fields()->AddVarint($number$, value);\n");
    }
    else {
      iVar1 = *(int *)(this_00 + 0x38);
      bVar2 = FieldDescriptor::is_packed(this_00);
      uVar4 = 2;
      i = extraout_EDX;
      if (!bVar2) {
        TVar3 = FieldDescriptor::type(this_00);
        uVar4 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
        i = extraout_EDX_00;
      }
      SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)(iVar1 << 3 | uVar4),i);
      io::Printer::Print(printer,
                         "} else {\n  unknown_fields_stream.WriteVarint32($tag$u);\n  unknown_fields_stream.WriteVarint32(value);\n"
                         ,"tag",&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    text = "}\n";
  }
  io::Printer::Print(printer,variables,text);
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "int value;\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
    "       input, &value)));\n");
  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    printer->Print(variables_,
      "set_$name$(static_cast< $type$ >(value));\n");
  } else {
    printer->Print(variables_,
      "if ($type$_IsValid(value)) {\n"
      "  set_$name$(static_cast< $type$ >(value));\n");
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(variables_,
        "} else {\n"
        "  mutable_unknown_fields()->AddVarint($number$, value);\n");
    } else {
      printer->Print(
        "} else {\n"
        "  unknown_fields_stream.WriteVarint32($tag$u);\n"
        "  unknown_fields_stream.WriteVarint32(value);\n",
        "tag", SimpleItoa(internal::WireFormat::MakeTag(descriptor_)));
    }
    printer->Print(variables_,
      "}\n");
  }
}